

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

uint __thiscall Js::FunctionBody::GetLoopNumberWithLock(FunctionBody *this,LoopHeader *loopHeader)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  LoopHeader *pLVar5;
  undefined4 *puVar6;
  uint loopNum;
  LoopHeader *loopHeaderArray;
  LoopHeader *loopHeader_local;
  FunctionBody *this_local;
  
  pLVar5 = GetLoopHeaderArrayWithLock(this);
  if (loopHeader < pLVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xff9,"(loopHeader >= loopHeaderArray)",
                                "loopHeader >= loopHeaderArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar3 = (uint)(((long)loopHeader - (long)pLVar5) / 0x30);
  uVar4 = GetLoopCount(this);
  if (uVar4 <= uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xffb,"(loopNum < GetLoopCount())","loopNum < GetLoopCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return uVar3;
}

Assistant:

uint
    FunctionBody::GetLoopNumberWithLock(LoopHeader const * loopHeader) const
    {
        LoopHeader* loopHeaderArray = this->GetLoopHeaderArrayWithLock();
        Assert(loopHeader >= loopHeaderArray);
        uint loopNum = (uint)(loopHeader - loopHeaderArray);
        Assert(loopNum < GetLoopCount());
        return loopNum;
    }